

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O0

void __thiscall pg::QPTSolver::run(QPTSolver *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _Setw _Var4;
  ostream *poVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  uintqueue *puVar10;
  uint *puVar11;
  size_t newsize;
  ulong uVar12;
  int local_f0;
  int local_ec;
  int local_d4;
  int local_bc;
  int local_8c;
  uint64_t c_1;
  uint64_t c;
  uint64_t _c;
  long _a;
  long _l;
  int i;
  int big_k;
  int k1;
  int k0;
  int max1;
  int max0;
  unsigned_long goal1;
  unsigned_long goal0;
  QPTSolver *this_local;
  uintqueue *local_10;
  
  goal0 = (unsigned_long)this;
  updateState(this,&goal1,(unsigned_long *)&max1,&k0,&k1,&big_k,&i);
  poVar5 = std::operator<<((this->super_Solver).logger,"for odd with even measures: n0=");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,goal1);
  poVar5 = std::operator<<(poVar5,", k=");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,big_k);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((this->super_Solver).logger,"for even with odd measures: n1=");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,_max1);
  poVar5 = std::operator<<(poVar5,", k=");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,i);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  if (i < big_k) {
    local_8c = big_k;
  }
  else {
    local_8c = i;
  }
  lVar7 = Solver::nodecount(&this->super_Solver);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_8c * lVar7;
  uVar8 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  piVar9 = (int *)operator_new__(uVar8);
  this->pm_nodes = piVar9;
  uVar8 = Solver::nodecount(&this->super_Solver);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  uVar8 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  piVar9 = (int *)operator_new__(uVar8);
  this->strategy = piVar9;
  puVar10 = &this->todo;
  lVar7 = Solver::nodecount(&this->super_Solver);
  this_local._4_4_ = (uint)lVar7;
  (this->todo).pointer = 0;
  local_10 = puVar10;
  if ((puVar10->queue != (uint *)0x0) && (puVar10->queue != (uint *)0x0)) {
    operator_delete__(puVar10->queue);
  }
  uVar8 = SUB168(ZEXT416(this_local._4_4_) * ZEXT816(4),0);
  if (SUB168(ZEXT416(this_local._4_4_) * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  puVar11 = (uint *)operator_new__(uVar8);
  puVar10->queue = puVar11;
  newsize = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->dirty,newsize);
  this->lift_count = 0;
  this->lift_attempt = 0;
  if ((this->bounded & 1U) == 0) {
    this->pl = 0;
    this->k = big_k;
    this->max = k0;
    if (k1 == -1) {
      local_ec = 0;
    }
    else {
      local_ec = k1;
    }
    this->maxo = local_ec;
    this->goal = goal1;
    liftloop(this);
    uVar8 = Game::count_unsolved((this->super_Solver).game);
    poVar5 = std::operator<<((this->super_Solver).logger,"after even, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->lift_count);
    poVar5 = std::operator<<(poVar5," lifts, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->lift_attempt);
    poVar5 = std::operator<<(poVar5," lift attempts, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar8);
    poVar5 = std::operator<<(poVar5," unsolved left.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    if (uVar8 != 0) {
      updateState(this,&goal1,(unsigned_long *)&max1,&k0,&k1,&big_k,&i);
      this->pl = 1;
      this->k = i;
      this->max = k1;
      if (k0 == -1) {
        local_f0 = 1;
      }
      else {
        local_f0 = k0;
      }
      this->maxo = local_f0;
      this->goal = _max1;
      liftloop(this);
    }
    poVar5 = std::operator<<((this->super_Solver).logger,"solved with ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->lift_count);
    poVar5 = std::operator<<(poVar5," lifts, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->lift_attempt);
    poVar5 = std::operator<<(poVar5," lift attempts.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    for (_l._0_4_ = 1; (int)_l <= local_8c; _l._0_4_ = (int)_l + 1) {
      lVar7 = this->lift_count;
      lVar1 = this->lift_attempt;
      uVar8 = Game::count_unsolved((this->super_Solver).game);
      this->pl = 0;
      this->k = (int)_l;
      this->max = k0;
      if (k1 == -1) {
        local_bc = 0;
      }
      else {
        local_bc = k1;
      }
      this->maxo = local_bc;
      this->goal = goal1;
      liftloop(this);
      uVar12 = Game::count_unsolved((this->super_Solver).game);
      poVar5 = std::operator<<((this->super_Solver).logger,"after even with k=");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->k);
      poVar5 = std::operator<<(poVar5,", ");
      _Var4 = std::setw(9);
      poVar5 = std::operator<<(poVar5,_Var4);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->lift_count - lVar7);
      poVar5 = std::operator<<(poVar5," lifts, ");
      _Var4 = std::setw(9);
      poVar5 = std::operator<<(poVar5,_Var4);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->lift_attempt - lVar1);
      poVar5 = std::operator<<(poVar5," lift attempts, ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar12);
      poVar5 = std::operator<<(poVar5," unsolved left.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      if (uVar12 == 0) break;
      if (uVar12 != uVar8) {
        updateState(this,&goal1,(unsigned_long *)&max1,&k0,&k1,&big_k,&i);
      }
      lVar7 = this->lift_count;
      lVar1 = this->lift_attempt;
      this->pl = 1;
      this->k = (int)_l;
      this->max = k1;
      if (k0 == -1) {
        local_d4 = 1;
      }
      else {
        local_d4 = k0;
      }
      this->maxo = local_d4;
      this->goal = _max1;
      liftloop(this);
      uVar12 = Game::count_unsolved((this->super_Solver).game);
      poVar5 = std::operator<<((this->super_Solver).logger,"after odd  with k=");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->k);
      poVar5 = std::operator<<(poVar5,", ");
      _Var4 = std::setw(9);
      poVar5 = std::operator<<(poVar5,_Var4);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->lift_count - lVar7);
      poVar5 = std::operator<<(poVar5," lifts, ");
      _Var4 = std::setw(9);
      poVar5 = std::operator<<(poVar5,_Var4);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->lift_attempt - lVar1);
      poVar5 = std::operator<<(poVar5," lift attempts, ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar12);
      poVar5 = std::operator<<(poVar5," unsolved left.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      if (uVar12 == 0) break;
      if (uVar12 != uVar8) {
        updateState(this,&goal1,(unsigned_long *)&max1,&k0,&k1,&big_k,&i);
        _l._0_4_ = (int)_l + -1;
      }
    }
    poVar5 = std::operator<<((this->super_Solver).logger,"solved with ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->lift_count);
    poVar5 = std::operator<<(poVar5," lifts, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->lift_attempt);
    poVar5 = std::operator<<(poVar5," lift attempts, max k ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)_l);
    poVar5 = std::operator<<(poVar5,".");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  if (this->pm_nodes != (int *)0x0) {
    operator_delete__(this->pm_nodes);
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  return;
}

Assistant:

void
QPTSolver::run()
{
    unsigned long goal0, goal1;
    int max0, max1;
    int k0, k1;

    updateState(goal0, goal1, max0, max1, k0, k1);
    
    logger << "for odd with even measures: n0=" << goal0 << ", k=" << k0 << std::endl;
    logger << "for even with odd measures: n1=" << goal1 << ", k=" << k1 << std::endl;

    // for allocation, just use biggest k
    int big_k = k0 > k1 ? k0 : k1;

    // now create the data structure, for each vertex a PM
    pm_nodes = new int[big_k * nodecount()];
    strategy = new int[nodecount()];

    // initialize todo/dirty queues
    todo.resize(nodecount());
    dirty.resize(nodecount());

    lift_count = 0;
    lift_attempt = 0;

    if (bounded) {
        int i;
        for (i=1; i<=big_k; i++) {
            long _l = lift_count, _a = lift_attempt;
            uint64_t _c = game.count_unsolved();
            uint64_t c = _c;

            /*if (i <= k0)*/ {
                pl = 0;
                k = i;
                max = max0;
                maxo = max1 != -1 ? max1 : 0; // used in bump
                goal = goal0;
                liftloop();

                c = game.count_unsolved();
                logger << "after even with k=" << k << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
                if (c == 0) break;

                if (c != _c) updateState(goal0, goal1, max0, max1, k0, k1);
                _l = lift_count;
                _a = lift_attempt;
            }
            /*if (i <= k1)*/ {
                pl = 1;
                k = i;
                max = max1;
                maxo = max0 != -1 ? max0 : 1; // used in bump
                goal = goal1;
                liftloop();

                c = game.count_unsolved();
                logger << "after odd  with k=" << k << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
                if (c == 0) break;

                if (c != _c) updateState(goal0, goal1, max0, max1, k0, k1);
            }
            if (c != _c) i--;
        } 

        logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts, max k " << i << "." << std::endl;
    } else if (ODDFIRST) {
        pl = 1;
        k = k1;
        max = max1;
        maxo = max0 != -1 ? max0 : 1; // used in bump
        goal = goal1;
        liftloop();

        uint64_t c = game.count_unsolved();
        logger << "after odd, " << lift_count << " lifts, " << lift_attempt << " lift attempts, " << c << " unsolved left." << std::endl;

        if (c != 0) {
            updateState(goal0, goal1, max0, max1, k0, k1);

            pl = 0;
            k = k0;
            max = max0;
            maxo = max1 != -1 ? max1 : 0; // used in bump
            goal = goal0;
            liftloop();
        }

        logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
    } else {
        pl = 0;
        k = k0;
        max = max0;
        maxo = max1 != -1 ? max1 : 0; // used in bump
        goal = goal0;
        liftloop();

        uint64_t c = game.count_unsolved();
        logger << "after even, " << lift_count << " lifts, " << lift_attempt << " lift attempts, " << c << " unsolved left." << std::endl;

        if (c != 0) {
            updateState(goal0, goal1, max0, max1, k0, k1);

            pl = 1;
            k = k1;
            max = max1;
            maxo = max0 != -1 ? max0 : 1; // used in bump
            goal = goal1;
            liftloop();
        }

        logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
    }

    delete[] pm_nodes;
    delete[] strategy;
}